

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::NewArrayExpression::fromSyntax
          (Compilation *compilation,NewArrayExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  Expression *args_1;
  Type *context_00;
  NewArrayExpressionSyntax *pNVar1;
  bool bVar2;
  Type *pTVar3;
  ExpressionSyntax *pEVar4;
  SourceRange local_98;
  Compilation *local_88;
  NewArrayExpression *result;
  Token local_78;
  SourceLocation local_68;
  Expression *local_60;
  Expression *initExpr;
  Expression *local_50;
  Expression *sizeExpr;
  DiagCode local_34;
  Type *local_30;
  Type *assignmentTarget_local;
  ASTContext *context_local;
  NewArrayExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  local_30 = assignmentTarget;
  assignmentTarget_local = (Type *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (NewArrayExpressionSyntax *)compilation;
  if ((assignmentTarget == (Type *)0x0) ||
     (pTVar3 = Type::getCanonicalType(assignmentTarget), pNVar1 = syntax_local,
     (pTVar3->super_Symbol).kind != DynamicArrayType)) {
    pTVar3 = assignmentTarget_local;
    local_34.subsystem = Expressions;
    local_34.code = 0x6b;
    _sizeExpr = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    ASTContext::addDiag((ASTContext *)pTVar3,local_34,_sizeExpr);
    compilation_local =
         (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)0x0);
  }
  else {
    pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)
                        &context_local->randomizeDetails);
    pTVar3 = assignmentTarget_local;
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&initExpr,None);
    local_50 = Expression::selfDetermined
                         ((Compilation *)pNVar1,pEVar4,(ASTContext *)pTVar3,
                          (bitmask<slang::ast::ASTFlags>)initExpr);
    pTVar3 = local_30;
    local_60 = (Expression *)0x0;
    if (*(long *)&context_local[1].lookupIndex != 0) {
      pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)
                          (*(long *)&context_local[1].lookupIndex + 0x20));
      local_78 = slang::syntax::SyntaxNode::getFirstToken
                           (*(SyntaxNode **)&context_local[1].lookupIndex);
      local_68 = parsing::Token::location(&local_78);
      context_00 = assignmentTarget_local;
      bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&result,None);
      local_60 = Expression::bindRValue
                           (pTVar3,pEVar4,local_68,(ASTContext *)context_00,
                            (bitmask<slang::ast::ASTFlags>)result);
    }
    pNVar1 = syntax_local;
    pTVar3 = local_30;
    args_1 = local_50;
    local_98 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    local_88 = (Compilation *)
               BumpAllocator::
               emplace<slang::ast::NewArrayExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const*&,slang::SourceRange>
                         ((BumpAllocator *)pNVar1,pTVar3,args_1,&local_60,&local_98);
    bVar2 = Expression::bad(local_50);
    if ((bVar2) || ((local_60 != (Expression *)0x0 && (bVar2 = Expression::bad(local_60), bVar2))))
    {
      compilation_local =
           (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_88);
    }
    else {
      bVar2 = ASTContext::requireIntegral((ASTContext *)assignmentTarget_local,local_50);
      if (bVar2) {
        compilation_local = local_88;
      }
      else {
        compilation_local =
             (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_88);
      }
    }
  }
  return (Expression *)compilation_local;
}

Assistant:

Expression& NewArrayExpression::fromSyntax(Compilation& compilation,
                                           const NewArrayExpressionSyntax& syntax,
                                           const ASTContext& context,
                                           const Type* assignmentTarget) {
    if (!assignmentTarget ||
        assignmentTarget->getCanonicalType().kind != SymbolKind::DynamicArrayType) {
        context.addDiag(diag::NewArrayTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto& sizeExpr = selfDetermined(compilation, *syntax.sizeExpr, context);
    const Expression* initExpr = nullptr;
    if (syntax.initializer) {
        initExpr = &bindRValue(*assignmentTarget, *syntax.initializer->expression,
                               syntax.initializer->getFirstToken().location(), context);
    }

    auto result = compilation.emplace<NewArrayExpression>(*assignmentTarget, sizeExpr, initExpr,
                                                          syntax.sourceRange());
    if (sizeExpr.bad() || (initExpr && initExpr->bad()))
        return badExpr(compilation, result);

    if (!context.requireIntegral(sizeExpr))
        return badExpr(compilation, result);

    return *result;
}